

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action)

{
  unsigned_long uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  long lVar10;
  ulong *puVar11;
  ulong *puVar12;
  unsigned_long uVar13;
  ulong *puVar14;
  unsigned_long uVar15;
  longdouble in_ST0;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble in_ST1;
  longdouble lVar20;
  longdouble lVar21;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble local_134;
  longdouble local_108;
  ulong local_c0;
  double local_80;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  uVar15 = Xc_indptr[col_num];
  uVar1 = Xc_indptr[col_num + 1];
  local_80 = -INFINITY;
  if ((uVar15 != uVar1) && (uVar3 = (end - st) + 1, 1 < uVar3)) {
    puVar11 = ix_arr + st;
    puVar8 = ix_arr + end + 1;
    uVar9 = (long)puVar8 - (long)puVar11 >> 3;
    if (0 < (long)uVar9) {
      do {
        uVar4 = uVar9 >> 1;
        uVar5 = ~uVar4 + uVar9;
        uVar9 = uVar4;
        if ((puVar11 + uVar4 + 1)[-1] < Xc_ind[uVar15]) {
          puVar11 = puVar11 + uVar4 + 1;
          uVar9 = uVar5;
        }
      } while (0 < (long)uVar9);
    }
    uVar9 = Xc_ind[uVar1 - 1];
    if (missing_action == Fail) {
      lVar21 = (longdouble)0;
      lVar16 = lVar21;
      local_134 = lVar21;
      local_108 = lVar21;
      if (uVar15 != uVar1 && puVar11 != puVar8) {
        lVar16 = (longdouble)0;
        lVar21 = lVar16;
        local_134 = lVar16;
        local_108 = lVar16;
        while (uVar4 = *puVar11, uVar4 <= uVar9) {
          puVar14 = Xc_ind + uVar15;
          uVar5 = *puVar14;
          if (uVar5 == uVar4) {
            lVar21 = lVar21 + (longdouble)Xc[uVar15];
            lVar16 = in_ST2;
            lVar18 = in_ST3;
            in_ST2 = in_ST3;
            lVar19 = in_ST3;
            fmal();
            fmal();
            fmal();
            local_134 = in_ST0;
            local_108 = in_ST1;
            if ((puVar11 == ix_arr + end) || (uVar15 == uVar1 - 1)) break;
            puVar14 = puVar14 + 1;
            puVar11 = puVar11 + 1;
            uVar4 = (long)((long)Xc_ind + (uVar1 * 8 - (long)puVar14)) >> 3;
            if (0 < (long)uVar4) {
              do {
                uVar5 = uVar4 >> 1;
                uVar6 = ~uVar5 + uVar4;
                uVar4 = uVar5;
                if (puVar14[uVar5] < *puVar11) {
                  puVar14 = puVar14 + uVar5 + 1;
                  uVar4 = uVar6;
                }
              } while (0 < (long)uVar4);
            }
            uVar15 = (long)puVar14 - (long)Xc_ind >> 3;
            lVar17 = in_ST3;
            in_ST3 = lVar19;
          }
          else {
            lVar17 = in_ST0;
            lVar18 = in_ST1;
            if (uVar4 < uVar5) {
              puVar11 = puVar11 + 1;
              uVar4 = (long)puVar8 - (long)puVar11 >> 3;
              while (0 < (long)uVar4) {
                uVar6 = uVar4 >> 1;
                uVar7 = ~uVar6 + uVar4;
                uVar4 = uVar6;
                if ((puVar11 + uVar6 + 1)[-1] < uVar5) {
                  puVar11 = puVar11 + uVar6 + 1;
                  uVar4 = uVar7;
                }
              }
            }
            else {
              puVar12 = puVar14 + 1;
              uVar5 = (long)((long)Xc_ind + (uVar1 * 8 - (long)(puVar14 + 1))) >> 3;
              while (0 < (long)uVar5) {
                uVar6 = uVar5 >> 1;
                uVar7 = ~uVar6 + uVar5;
                uVar5 = uVar6;
                if (puVar12[uVar6] < uVar4) {
                  puVar12 = puVar12 + uVar6 + 1;
                  uVar5 = uVar7;
                }
              }
              uVar15 = (long)puVar12 - (long)Xc_ind >> 3;
            }
          }
          if ((puVar11 == puVar8) || (in_ST0 = lVar17, in_ST1 = lVar18, uVar15 == uVar1)) break;
        }
      }
    }
    else {
      lVar21 = (longdouble)0;
      lVar16 = lVar21;
      local_134 = lVar21;
      local_108 = lVar21;
      local_c0 = uVar3;
      if (uVar15 != uVar1 && puVar11 != puVar8) {
        lVar21 = (longdouble)0;
        uVar13 = uVar15;
        lVar16 = lVar21;
        local_134 = lVar21;
        local_108 = lVar21;
        while (uVar4 = *puVar11, uVar4 <= uVar9) {
          puVar14 = Xc_ind + uVar13;
          uVar5 = *puVar14;
          lVar17 = in_ST0;
          lVar18 = in_ST1;
          if (uVar5 == uVar4) {
            lVar19 = (longdouble)Xc[uVar13];
            local_68 = SUB108(lVar19,0);
            uStack_60 = (ushort)((unkuint10)lVar19 >> 0x40);
            if ((NAN(Xc[uVar13])) || ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000)
               ) {
              local_c0 = local_c0 - 1;
            }
            else {
              lVar21 = lVar21 + lVar19;
              lVar16 = in_ST2;
              lVar18 = in_ST3;
              in_ST2 = in_ST3;
              lVar19 = in_ST3;
              fmal();
              fmal();
              fmal();
              lVar17 = in_ST3;
              in_ST3 = lVar19;
              local_134 = in_ST0;
              local_108 = in_ST1;
            }
            if ((puVar11 == ix_arr + end) || (uVar13 == uVar1 - 1)) break;
            puVar12 = puVar14 + 1;
            puVar11 = puVar11 + 1;
            uVar4 = (long)((long)Xc_ind + (uVar1 * 8 - (long)puVar12)) >> 3;
            if (0 < (long)uVar4) {
              do {
                uVar5 = uVar4 >> 1;
                uVar6 = ~uVar5 + uVar4;
                uVar4 = uVar5;
                if (puVar12[uVar5] < *puVar11) {
                  puVar12 = puVar12 + uVar5 + 1;
                  uVar4 = uVar6;
                }
              } while (0 < (long)uVar4);
            }
LAB_00132d19:
            uVar13 = (long)puVar12 - (long)Xc_ind >> 3;
            in_ST0 = lVar17;
            in_ST1 = lVar18;
          }
          else {
            if (uVar5 <= uVar4) {
              puVar12 = puVar14 + 1;
              uVar5 = (long)((long)Xc_ind + (uVar1 * 8 - (long)(puVar14 + 1))) >> 3;
              while (0 < (long)uVar5) {
                uVar6 = uVar5 >> 1;
                uVar7 = ~uVar6 + uVar5;
                uVar5 = uVar6;
                if (puVar12[uVar6] < uVar4) {
                  puVar12 = puVar12 + uVar6 + 1;
                  uVar5 = uVar7;
                }
              }
              goto LAB_00132d19;
            }
            puVar11 = puVar11 + 1;
            uVar4 = (long)puVar8 - (long)puVar11 >> 3;
            while (0 < (long)uVar4) {
              uVar6 = uVar4 >> 1;
              uVar7 = ~uVar6 + uVar4;
              uVar4 = uVar6;
              if ((puVar11 + uVar6 + 1)[-1] < uVar5) {
                puVar11 = puVar11 + uVar6 + 1;
                uVar4 = uVar7;
              }
            }
          }
          if ((puVar11 == puVar8) || (uVar13 == uVar1)) break;
        }
      }
      lVar10 = uVar15 + uVar3;
      uVar3 = local_c0;
      if (local_c0 <= lVar10 - uVar1) {
        return -INFINITY;
      }
    }
    if (1 < uVar3) {
      if ((local_134 != (longdouble)0) || (NAN(local_134) || NAN((longdouble)0))) {
        if ((local_134 != lVar21 * lVar21) || (NAN(local_134) || NAN(lVar21 * lVar21))) {
          lVar17 = (longdouble)(long)uVar3 + (longdouble)(float)(&DAT_0036b0d8)[(long)uVar3 < 0];
          lVar18 = lVar21 / lVar17;
          lVar19 = lVar18 * lVar18;
          lVar20 = local_134 / lVar17 - lVar19;
          if ((!NAN(lVar20)) &&
             (((longdouble)2.220446e-16 < lVar20 ||
              (bVar2 = check_more_than_two_unique_values<double,unsigned_long>
                                 (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar2))
             )) {
            if (lVar20 <= (longdouble)0) {
              local_80 = 0.0;
            }
            else {
              lVar21 = (lVar19 * lVar18 * lVar18 * lVar17 +
                       lVar21 * (longdouble)-4.0 * lVar19 * lVar18 +
                       local_134 * (longdouble)6.0 * lVar19 +
                       lVar16 + local_108 * (longdouble)-4.0 * lVar18) / (lVar20 * lVar20 * lVar17);
              uStack_70 = (ushort)((unkuint10)lVar21 >> 0x40);
              local_78 = SUB108(lVar21,0);
              if ((((unkuint10)lVar21 & 0x7fff) == 0 ||
                   (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) &&
                 (local_80 = (double)lVar21, local_80 <= 0.0)) {
                local_80 = 0.0;
              }
            }
          }
        }
      }
    }
  }
  return local_80;
}

Assistant:

double calc_kurtosis(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = end - st + 1;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt--;
                }

                else
                {
                    /* TODO: is it safe to use FMA here? some calculations rely on assuming that
                       some of these 's' are larger than the others. Would this procedure be guaranteed
                       to preserve such differences if done with a mixture of sums and FMAs? */
                    x_sq = square(xval);
                    s1 += xval;
                    s2  = std::fma(xval, xval, s2);
                    s3  = std::fma(x_sq, xval, s3);
                    s4  = std::fma(x_sq, x_sq, s4);
                    // s1 += pw1(xval);
                    // s2 += pw2(xval);
                    // s3 += pw3(xval);
                    // s4 += pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= (end - st + 1) - (Xc_indptr[col_num+1] - Xc_indptr[col_num]))) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}